

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

Datatype * __thiscall
TypeOpIntSdiv::getInputCast(TypeOpIntSdiv *this,PcodeOp *op,int4 slot,CastStrategy *castStrategy)

{
  int iVar1;
  Datatype *pDVar2;
  Varnode *this_00;
  HighVariable *this_01;
  Datatype *pDVar3;
  undefined4 extraout_var;
  Datatype *curtype;
  Datatype *reqtype;
  CastStrategy *castStrategy_local;
  int4 slot_local;
  PcodeOp *op_local;
  TypeOpIntSdiv *this_local;
  
  pDVar2 = PcodeOp::inputTypeLocal(op,slot);
  this_00 = PcodeOp::getIn(op,slot);
  this_01 = Varnode::getHigh(this_00);
  pDVar3 = HighVariable::getType(this_01);
  iVar1 = (*castStrategy->_vptr_CastStrategy[6])(castStrategy,pDVar2,pDVar3,1);
  return (Datatype *)CONCAT44(extraout_var,iVar1);
}

Assistant:

Datatype *TypeOpIntSdiv::getInputCast(const PcodeOp *op,int4 slot,const CastStrategy *castStrategy) const

{
  Datatype *reqtype = op->inputTypeLocal(slot);
  Datatype *curtype = op->getIn(slot)->getHigh()->getType();
  return castStrategy->castStandard(reqtype,curtype,true,true);
}